

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dbwrapper.cpp
# Opt level: O3

bool __thiscall CDBWrapper::WriteBatch(CDBWrapper *this,CDBBatch *batch,bool fSync)

{
  DB *pDVar1;
  bool bVar2;
  Logger *pLVar3;
  size_t sVar4;
  unique_ptr<LevelDBContext,_std::default_delete<LevelDBContext>_> *puVar5;
  long in_FS_OFFSET;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  string_view source_file;
  string_view logging_function;
  double mem_after;
  Status status;
  double mem_before;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pLVar3 = LogInstance();
  bVar2 = BCLog::Logger::WillLogCategoryLevel(pLVar3,LEVELDB,Debug);
  mem_before = 0.0;
  if (bVar2) {
    sVar4 = DynamicMemoryUsage(this);
    auVar6._8_4_ = (int)(sVar4 >> 0x20);
    auVar6._0_8_ = sVar4;
    auVar6._12_4_ = 0x45300000;
    mem_before = ((auVar6._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)sVar4) - 4503599627370496.0)) * 0.0009765625 *
                 0.0009765625;
  }
  puVar5 = inline_assertion_check<true,std::unique_ptr<LevelDBContext,std::default_delete<LevelDBContext>>const&>
                     (&this->m_db_context,
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/dbwrapper.h"
                      ,0xd3,"DBContext","m_db_context");
  pDVar1 = ((puVar5->_M_t).
            super___uniq_ptr_impl<LevelDBContext,_std::default_delete<LevelDBContext>_>._M_t.
            super__Tuple_impl<0UL,_LevelDBContext_*,_std::default_delete<LevelDBContext>_>.
            super__Head_base<0UL,_LevelDBContext_*,_false>._M_head_impl)->pdb;
  puVar5 = inline_assertion_check<true,std::unique_ptr<LevelDBContext,std::default_delete<LevelDBContext>>const&>
                     (&this->m_db_context,
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/dbwrapper.h"
                      ,0xd3,"DBContext","m_db_context");
  (*pDVar1->_vptr_DB[4])
            (&status,pDVar1,
             &((puVar5->_M_t).
               super___uniq_ptr_impl<LevelDBContext,_std::default_delete<LevelDBContext>_>._M_t.
               super__Tuple_impl<0UL,_LevelDBContext_*,_std::default_delete<LevelDBContext>_>.
               super__Head_base<0UL,_LevelDBContext_*,_false>._M_head_impl)->writeoptions + fSync,
             (batch->m_impl_batch)._M_t.
             super___uniq_ptr_impl<CDBBatch::WriteBatchImpl,_std::default_delete<CDBBatch::WriteBatchImpl>_>
             ._M_t.
             super__Tuple_impl<0UL,_CDBBatch::WriteBatchImpl_*,_std::default_delete<CDBBatch::WriteBatchImpl>_>
             .super__Head_base<0UL,_CDBBatch::WriteBatchImpl_*,_false>._M_head_impl);
  HandleError(&status);
  if (bVar2) {
    sVar4 = DynamicMemoryUsage(this);
    auVar7._8_4_ = (int)(sVar4 >> 0x20);
    auVar7._0_8_ = sVar4;
    auVar7._12_4_ = 0x45300000;
    mem_after = ((auVar7._8_8_ - 1.9342813113834067e+25) +
                ((double)CONCAT44(0x43300000,(int)sVar4) - 4503599627370496.0)) * 0.0009765625 *
                0.0009765625;
    pLVar3 = LogInstance();
    bVar2 = BCLog::Logger::WillLogCategoryLevel(pLVar3,LEVELDB,Debug);
    if (bVar2) {
      source_file._M_str =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/dbwrapper.cpp"
      ;
      source_file._M_len = 0x5d;
      logging_function._M_str = "WriteBatch";
      logging_function._M_len = 10;
      LogPrintFormatInternal<std::__cxx11::string,double,double>
                (logging_function,source_file,0x12f,LEVELDB,Debug,
                 (ConstevalFormatString<3U>)0xf6e444,&this->m_name,&mem_before,&mem_after);
    }
  }
  if (status.state_ != (char *)0x0) {
    operator_delete__(status.state_);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return true;
  }
  __stack_chk_fail();
}

Assistant:

bool CDBWrapper::WriteBatch(CDBBatch& batch, bool fSync)
{
    const bool log_memory = LogAcceptCategory(BCLog::LEVELDB, BCLog::Level::Debug);
    double mem_before = 0;
    if (log_memory) {
        mem_before = DynamicMemoryUsage() / 1024.0 / 1024;
    }
    leveldb::Status status = DBContext().pdb->Write(fSync ? DBContext().syncoptions : DBContext().writeoptions, &batch.m_impl_batch->batch);
    HandleError(status);
    if (log_memory) {
        double mem_after = DynamicMemoryUsage() / 1024.0 / 1024;
        LogDebug(BCLog::LEVELDB, "WriteBatch memory usage: db=%s, before=%.1fMiB, after=%.1fMiB\n",
                 m_name, mem_before, mem_after);
    }
    return true;
}